

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded_opt.hpp
# Opt level: O3

handle * __thiscall
gmlc::libguarded::guarded_opt<int,std::timed_mutex>::
try_lock_until<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
          (handle *__return_storage_ptr__,void *this,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_R8;
  unique_lock<std::timed_mutex> local_18;
  
  if (*(char *)((long)this + 0x30) == '\x01') {
    try_lock_handle_until<int,std::timed_mutex,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (__return_storage_ptr__,(libguarded *)this,(int *)((long)this + 8),(timed_mutex *)tp,
               in_R8);
  }
  else {
    __return_storage_ptr__->data = (pointer)this;
    (__return_storage_ptr__->m_handle_lock)._M_device = (mutex_type *)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    local_18._M_device = (mutex_type *)0x0;
    local_18._M_owns = false;
    std::unique_lock<std::timed_mutex>::~unique_lock(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

auto guarded_opt<T, M>::try_lock_until(const TimePoint& tp) -> handle
{
    return (enabled) ? try_lock_handle_until(&m_obj, m_mutex, tp) :
                       handle(&m_obj, std::unique_lock<M>());
}